

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::InternalFormatQueryTests::init
          (InternalFormatQueryTests *this,EVP_PKEY_CTX *ctx)

{
  char *name_00;
  _func_int **pp_Var1;
  int extraout_EAX;
  TestNode *pTVar2;
  char *description;
  long *plVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  long *plVar6;
  long lVar7;
  string desc;
  string name;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  deUint32 local_a4;
  TestNode *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  TestContext *local_58;
  undefined8 uStack_50;
  long local_40;
  TestNode *local_38;
  
  lVar7 = 0;
  local_a0 = (TestNode *)this;
  do {
    pTVar4 = local_a0;
    pTVar2 = (TestNode *)operator_new(0x70);
    local_58 = pTVar4->m_testCtx;
    name_00 = init::textureTargets[lVar7].name;
    local_a4 = init::textureTargets[lVar7].target;
    local_40 = lVar7;
    description = glu::getInternalFormatTargetName(local_a4);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,local_58,name_00,description);
    local_38 = pTVar2;
    tcu::TestNode::addChild(pTVar4,pTVar2);
    lVar7 = 8;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,*(char **)(&UNK_0215dca8 + lVar7),(allocator<char> *)local_78);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_88 = *plVar6;
        lStack_80 = plVar3[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar6;
        local_98 = (long *)*plVar3;
      }
      local_90 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Verify GL_SAMPLES of ","")
      ;
      plVar3 = (long *)std::__cxx11::string::append((char *)local_78);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_b8 = *plVar6;
        lStack_b0 = plVar3[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar6;
        local_c8 = (long *)*plVar3;
      }
      local_c0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      pTVar4 = (TestNode *)operator_new(0x88);
      pp_Var1 = local_a0[1]._vptr_TestNode;
      local_58 = *(TestContext **)((long)&init::internalFormats[0].name + lVar7);
      uStack_50 = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar4,(TestContext *)*pp_Var1,(char *)local_98,(char *)local_c8);
      pTVar4[1]._vptr_TestNode = pp_Var1;
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215df98;
      *(deUint32 *)&pTVar4[1].m_testCtx = local_a4;
      *(TestContext **)((long)&pTVar4[1].m_testCtx + 4) = local_58;
      tcu::TestNode::addChild(local_38,pTVar4);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      pTVar4 = local_a0;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x298);
    lVar7 = local_40 + 1;
  } while (lVar7 != 3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pTVar4->m_testCtx,"partial_query",
             "Query data to too short a buffer");
  tcu::TestNode::addChild(pTVar4,pTVar2);
  pTVar5 = (TestNode *)operator_new(0x78);
  pp_Var1 = pTVar4[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,(TestContext *)*pp_Var1,"num_sample_counts",
             "Query GL_NUM_SAMPLE_COUNTS to too short a buffer");
  pTVar5[1]._vptr_TestNode = pp_Var1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215dfe8;
  tcu::TestNode::addChild(pTVar2,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x78);
  pp_Var1 = pTVar4[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,(TestContext *)*pp_Var1,"samples",
             "Query GL_SAMPLES to too short a buffer");
  pTVar5[1]._vptr_TestNode = pp_Var1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e038;
  tcu::TestNode::addChild(pTVar2,pTVar5);
  return extraout_EAX;
}

Assistant:

void InternalFormatQueryTests::init (void)
{
	static const struct InternalFormat
	{
		const char*						name;
		glw::GLenum						format;
		FormatSamplesCase::FormatType	type;
	} internalFormats[] =
	{
		// color renderable
		{ "r8",						GL_R8,					FormatSamplesCase::FORMAT_COLOR			},
		{ "rg8",					GL_RG8,					FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb8",					GL_RGB8,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb565",					GL_RGB565,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba4",					GL_RGBA4,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb5_a1",				GL_RGB5_A1,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba8",					GL_RGBA8,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb10_a2",				GL_RGB10_A2,			FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb10_a2ui",				GL_RGB10_A2UI,			FormatSamplesCase::FORMAT_INT			},
		{ "srgb8_alpha8",			GL_SRGB8_ALPHA8,		FormatSamplesCase::FORMAT_COLOR			},
		{ "r8i",					GL_R8I,					FormatSamplesCase::FORMAT_INT			},
		{ "r8ui",					GL_R8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "r16i",					GL_R16I,				FormatSamplesCase::FORMAT_INT			},
		{ "r16ui",					GL_R16UI,				FormatSamplesCase::FORMAT_INT			},
		{ "r32i",					GL_R32I,				FormatSamplesCase::FORMAT_INT			},
		{ "r32ui",					GL_R32UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg8i",					GL_RG8I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg8ui",					GL_RG8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg16i",					GL_RG16I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg16ui",					GL_RG16UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32i",					GL_RG32I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32ui",					GL_RG32UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba8i",					GL_RGBA8I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba8ui",				GL_RGBA8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba16i",				GL_RGBA16I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba16ui",				GL_RGBA16UI,			FormatSamplesCase::FORMAT_INT			},
		{ "rgba32i",				GL_RGBA32I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba32ui",				GL_RGBA32UI,			FormatSamplesCase::FORMAT_INT			},

		// float formats
		{ "r16f",					GL_R16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rg16f",					GL_RG16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba16f",				GL_RGBA16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "r32f",					GL_R32F,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32f",					GL_RG32F,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba32f",				GL_RGBA32F,				FormatSamplesCase::FORMAT_INT			},
		{ "r11f_g11f_b10f",			GL_R11F_G11F_B10F,		FormatSamplesCase::FORMAT_COLOR			},

		// depth renderable
		{ "depth_component16",		GL_DEPTH_COMPONENT16,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth_component24",		GL_DEPTH_COMPONENT24,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth_component32f",		GL_DEPTH_COMPONENT32F,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth24_stencil8",		GL_DEPTH24_STENCIL8,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth32f_stencil8",		GL_DEPTH32F_STENCIL8,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},

		// stencil renderable
		{ "stencil_index8",			GL_STENCIL_INDEX8,		FormatSamplesCase::FORMAT_DEPTH_STENCIL	}
		// DEPTH24_STENCIL8,  duplicate
		// DEPTH32F_STENCIL8  duplicate
	};

	static const struct
	{
		const char*	name;
		deUint32	target;
	} textureTargets[] =
	{
		{ "renderbuffer",					GL_RENDERBUFFER					},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE		},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY	},
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++groupNdx)
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, textureTargets[groupNdx].name, glu::getInternalFormatTargetName(textureTargets[groupNdx].target));
		const glw::GLenum			texTarget	= textureTargets[groupNdx].target;

		addChild(group);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(internalFormats); ++caseNdx)
		{
			const std::string name = std::string(internalFormats[caseNdx].name) + "_samples";
			const std::string desc = std::string("Verify GL_SAMPLES of ") + internalFormats[caseNdx].name;

			group->addChild(new FormatSamplesCase(m_context, name.c_str(), desc.c_str(), texTarget, internalFormats[caseNdx].format, internalFormats[caseNdx].type));
		}
	}

	// Check buffer sizes are honored
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "partial_query", "Query data to too short a buffer");

		addChild(group);

		group->addChild(new NumSampleCountsBufferCase	(m_context, "num_sample_counts",	"Query GL_NUM_SAMPLE_COUNTS to too short a buffer"));
		group->addChild(new SamplesBufferCase			(m_context, "samples",				"Query GL_SAMPLES to too short a buffer"));
	}
}